

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O1

StrScanFmt lj_strscan_scan(uint8_t *p,MSize len,TValue *o,uint32_t opt)

{
  double dVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  byte bVar5;
  StrScanFmt SVar6;
  StrScanFmt SVar7;
  long lVar8;
  uint64_t uVar9;
  byte *pbVar10;
  byte *pbVar11;
  uint dig;
  uint neg;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  bool bVar19;
  bool bVar20;
  lua_Number lVar21;
  double dVar22;
  
  pbVar10 = p + len;
  neg = 0;
  pbVar18 = p;
  if ((""[(ulong)*p + 1] & 8) == 0) {
    do {
      p = pbVar18;
      bVar5 = *p;
      pbVar18 = p + 1;
    } while ((""[(ulong)bVar5 + 1] & 2) != 0);
    if ((bVar5 == 0x2b) || (bVar5 == 0x2d)) {
      neg = (uint)(bVar5 == 0x2d);
      p = p + 1;
    }
    else {
      neg = 0;
    }
    if (0x40 < *p) {
      uVar9 = 0xfff8000000000000;
      bVar5 = *p & 0xdf;
      pbVar18 = p;
      if (bVar5 == 0x4e) {
        if ((p[1] & 0xdf) == 0x41) {
          pbVar18 = p + (ulong)((p[2] & 0xdf) == 0x4e) * 3;
        }
      }
      else if (((bVar5 == 0x49) && ((p[1] & 0xdf) == 0x4e)) && ((p[2] & 0xdf) == 0x46)) {
        uVar9 = 0xfff0000000000000;
        if (neg == 0) {
          uVar9 = 0x7ff0000000000000;
        }
        pbVar17 = p + 3;
        pbVar18 = pbVar17;
        if ((((p[3] & 0xdf) == 0x49) && ((p[4] & 0xdf) == 0x4e)) &&
           (((p[5] & 0xdf) == 0x49 &&
            (((p[6] & 0xdf) == 0x54 && (pbVar18 = p + 8, (p[7] & 0xdf) != 0x59)))))) {
          pbVar18 = pbVar17;
        }
      }
      pbVar18 = pbVar18 + -1;
      do {
        pbVar17 = pbVar18 + 1;
        pbVar18 = pbVar18 + 1;
      } while ((""[(ulong)*pbVar17 + 1] & 2) != 0);
      if (pbVar18 < pbVar10 || *pbVar17 != 0) {
        return STRSCAN_ERROR;
      }
      goto LAB_00115b84;
    }
  }
  uVar13 = 10;
  if ((opt & 0x10) != 0) {
    uVar13 = 10;
    if (*p == 0x30) {
      uVar13 = 0;
    }
  }
  dig = 0;
  if (*p < 0x31) {
    bVar5 = 8;
    if (*p == 0x30) {
      if ((p[1] | 0x20) == 0x62) {
        p = p + 2;
        uVar13 = 2;
      }
      else if ((p[1] | 0x20) == 0x78) {
        p = p + 2;
        bVar5 = 0x10;
        uVar13 = 0x10;
      }
    }
    pbVar18 = (byte *)0x0;
    bVar19 = false;
    do {
      if (*p == 0x30) {
        bVar19 = true;
      }
      else {
        if (*p != 0x2e) goto LAB_0011591a;
        bVar20 = pbVar18 != (byte *)0x0;
        pbVar18 = p;
        if (bVar20) {
          return STRSCAN_ERROR;
        }
      }
      p = p + 1;
    } while( true );
  }
  bVar5 = 8;
  pbVar18 = (byte *)0x0;
  bVar19 = false;
LAB_0011591a:
  lVar8 = 0;
  uVar15 = 0;
  do {
    bVar2 = p[lVar8];
    if ((bVar5 & ""[(ulong)bVar2 + 1]) == 0) {
      if (bVar2 != 0x2e) {
        if (!bVar19 && dig == 0) {
          return STRSCAN_ERROR;
        }
        if (pbVar18 == (byte *)0x0) {
          SVar6 = STRSCAN_INT;
          iVar12 = 0;
          goto LAB_001159e6;
        }
        if (uVar13 == 2) {
          return STRSCAN_ERROR;
        }
        SVar6 = STRSCAN_NUM;
        if (dig == 0) {
          dig = 0;
          iVar12 = 0;
          goto LAB_001159e6;
        }
        pbVar17 = pbVar18 + ((ulong)(uint)-(int)p - lVar8) + 1;
        iVar16 = (int)pbVar17;
        if (-1 < iVar16) goto LAB_001159b7;
        pbVar11 = p + lVar8;
        iVar12 = ((int)pbVar18 + -(int)p) - (int)lVar8;
        break;
      }
      if (pbVar18 != (byte *)0x0) {
        return STRSCAN_ERROR;
      }
      pbVar18 = p + lVar8;
    }
    else {
      uVar15 = (bVar2 & 0xf) + uVar15 * 10;
      dig = dig + 1;
    }
    lVar8 = lVar8 + 1;
  } while( true );
  while( true ) {
    pbVar17 = (byte *)(ulong)(iVar16 + 1);
    dig = dig - 1;
    iVar12 = iVar12 + 1;
    if (-2 < iVar12) break;
    pbVar11 = pbVar11 + -1;
    iVar16 = (int)pbVar17;
    if (*pbVar11 != 0x30) goto LAB_001159b7;
  }
  iVar16 = 0;
LAB_001159b7:
  if (iVar16 < -0xfffff) {
    return STRSCAN_ERROR;
  }
  iVar12 = iVar16 * 4;
  if (uVar13 != 0x10) {
    iVar12 = iVar16;
  }
LAB_001159e6:
  pbVar18 = p + lVar8;
  if (9 < uVar13) {
    bVar5 = 0x65;
    if (uVar13 == 0x10) {
      bVar5 = 0x70;
    }
    if (bVar5 == (bVar2 | 0x20)) {
      bVar5 = p[lVar8 + 1];
      if ((bVar5 == 0x2b) || (bVar5 == 0x2d)) {
        lVar8 = lVar8 + 2;
        bVar19 = bVar5 != 0x2d;
      }
      else {
        lVar8 = lVar8 + 1;
        bVar19 = true;
      }
      pbVar18 = p + lVar8;
      if ((""[(ulong)*pbVar18 + 1] & 8) != 0) {
        uVar14 = *pbVar18 & 0xf;
        do {
          pbVar18 = pbVar18 + 1;
          if ((""[(ulong)*pbVar18 + 1] & 8) == 0) {
            uVar3 = -uVar14;
            if (bVar19) {
              uVar3 = uVar14;
            }
            iVar12 = iVar12 + uVar3;
            bVar19 = true;
            goto LAB_00115abc;
          }
          uVar14 = (*pbVar18 & 0xf) + uVar14 * 10;
        } while (uVar14 < 0x100000);
      }
      bVar19 = false;
LAB_00115abc:
      SVar6 = STRSCAN_NUM;
      if (!bVar19) {
        return STRSCAN_ERROR;
      }
    }
  }
  if (*pbVar18 != 0) {
    bVar5 = *pbVar18 | 0x20;
    if (bVar5 == 0x69) {
      if ((opt & 4) == 0) {
        return STRSCAN_ERROR;
      }
      pbVar18 = pbVar18 + 1;
      SVar6 = STRSCAN_IMAG;
    }
    else if (SVar6 == STRSCAN_INT) {
      bVar19 = bVar5 == 0x75;
      SVar6 = bVar19 + STRSCAN_INT;
      pbVar17 = pbVar18 + bVar19;
      if ((pbVar18[bVar19] & 0xdf) == 0x4c) {
        if ((pbVar17[1] & 0xdf) == 0x4c) {
          pbVar17 = pbVar17 + 2;
        }
        else {
          if ((opt & 0x10) == 0) {
            return STRSCAN_ERROR;
          }
          pbVar17 = pbVar17 + 1;
        }
        SVar6 = bVar19 + STRSCAN_I64;
      }
      if (((*pbVar17 & 0xdf) == 0x55) && ((SVar6 == STRSCAN_I64 || (SVar6 == STRSCAN_INT)))) {
        pbVar17 = pbVar17 + 1;
        SVar6 = SVar6 + STRSCAN_NUM;
      }
      if (((opt & 0x10) == 0) && (SVar6 == STRSCAN_U32)) {
        return STRSCAN_ERROR;
      }
      pbVar18 = pbVar17;
      if (((opt & 8) == 0) && (STRSCAN_U32 < SVar6)) {
        return STRSCAN_ERROR;
      }
    }
    pbVar18 = pbVar18 + -1;
    do {
      pbVar17 = pbVar18 + 1;
      pbVar18 = pbVar18 + 1;
    } while ((""[(ulong)*pbVar17 + 1] & 2) != 0);
    if (*pbVar17 != 0) {
      return STRSCAN_ERROR;
    }
  }
  if (pbVar18 < pbVar10) {
    return STRSCAN_ERROR;
  }
  if (((SVar6 != STRSCAN_INT) || (uVar13 != 10)) ||
     ((9 < dig && (((dig != 10 || (0x32 < *p)) || (neg + 0x80000000 <= uVar15)))))) {
    if ((uVar13 == 0) && (1 < SVar6 - STRSCAN_NUM)) {
      SVar6 = strscan_oct(p,o,SVar6,neg,dig);
      return SVar6;
    }
    if (uVar13 == 2) {
      SVar6 = strscan_bin(p,o,SVar6,opt,iVar12,neg,dig);
    }
    else if (uVar13 == 0x10) {
      SVar6 = strscan_hex(p,o,SVar6,opt,iVar12,neg,dig);
    }
    else {
      SVar6 = strscan_dec(p,o,SVar6,opt,iVar12,neg,dig);
    }
    if (((opt & 1) != 0) && (SVar6 == STRSCAN_NUM)) {
      SVar7 = STRSCAN_ERROR;
      dVar1 = o->n;
      dVar22 = (double)(int)dVar1;
      if ((dVar1 == dVar22) && (!NAN(dVar1) && !NAN(dVar22))) {
        (o->u32).lo = (int)dVar1;
        SVar7 = STRSCAN_INT;
      }
      if ((dVar1 == dVar22) && (!NAN(dVar1) && !NAN(dVar22))) {
        return SVar7;
      }
    }
    return SVar6;
  }
  if ((opt & 2) != 0) {
    lVar21 = (lua_Number)uVar15;
    if (neg != 0) {
      lVar21 = (lua_Number)((ulong)lVar21 | (ulong)DAT_0015eb10);
    }
    o->n = lVar21;
    return STRSCAN_NUM;
  }
  if ((neg == 0) || (uVar15 != 0)) {
    uVar4 = -uVar15;
    if (neg == 0) {
      uVar4 = uVar15;
    }
    (o->u32).lo = uVar4;
    return STRSCAN_INT;
  }
  uVar9 = 0x8000000000000000;
LAB_00115b84:
  o->u64 = uVar9;
  return STRSCAN_NUM;
}

Assistant:

StrScanFmt lj_strscan_scan(const uint8_t *p, MSize len, TValue *o,
			   uint32_t opt)
{
  int32_t neg = 0;
  const uint8_t *pe = p + len;

  /* Remove leading space, parse sign and non-numbers. */
  if (LJ_UNLIKELY(!lj_char_isdigit(*p))) {
    while (lj_char_isspace(*p)) p++;
    if (*p == '+' || *p == '-') neg = (*p++ == '-');
    if (LJ_UNLIKELY(*p >= 'A')) {  /* Parse "inf", "infinity" or "nan". */
      TValue tmp;
      setnanV(&tmp);
      if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'f')) {
	if (neg) setminfV(&tmp); else setpinfV(&tmp);
	p += 3;
	if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'i') &&
	    casecmp(p[3],'t') && casecmp(p[4],'y')) p += 5;
      } else if (casecmp(p[0],'n') && casecmp(p[1],'a') && casecmp(p[2],'n')) {
	p += 3;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p || p < pe) return STRSCAN_ERROR;
      o->u64 = tmp.u64;
      return STRSCAN_NUM;
    }
  }

  /* Parse regular number. */
  {
    StrScanFmt fmt = STRSCAN_INT;
    int cmask = LJ_CHAR_DIGIT;
    int base = (opt & STRSCAN_OPT_C) && *p == '0' ? 0 : 10;
    const uint8_t *sp, *dp = NULL;
    uint32_t dig = 0, hasdig = 0, x = 0;
    int32_t ex = 0;

    /* Determine base and skip leading zeros. */
    if (LJ_UNLIKELY(*p <= '0')) {
      if (*p == '0') {
	if (casecmp(p[1], 'x'))
	  base = 16, cmask = LJ_CHAR_XDIGIT, p += 2;
	else if (casecmp(p[1], 'b'))
	  base = 2, cmask = LJ_CHAR_DIGIT, p += 2;
      }
      for ( ; ; p++) {
	if (*p == '0') {
	  hasdig = 1;
	} else if (*p == '.') {
	  if (dp) return STRSCAN_ERROR;
	  dp = p;
	} else {
	  break;
	}
      }
    }

    /* Preliminary digit and decimal point scan. */
    for (sp = p; ; p++) {
      if (LJ_LIKELY(lj_char_isa(*p, cmask))) {
	x = x * 10 + (*p & 15);  /* For fast path below. */
	dig++;
      } else if (*p == '.') {
	if (dp) return STRSCAN_ERROR;
	dp = p;
      } else {
	break;
      }
    }
    if (!(hasdig | dig)) return STRSCAN_ERROR;

    /* Handle decimal point. */
    if (dp) {
      if (base == 2) return STRSCAN_ERROR;
      fmt = STRSCAN_NUM;
      if (dig) {
	ex = (int32_t)(dp-(p-1)); dp = p-1;
	while (ex < 0 && *dp-- == '0') ex++, dig--;  /* Skip trailing zeros. */
	if (ex <= -STRSCAN_MAXEXP) return STRSCAN_ERROR;
	if (base == 16) ex *= 4;
      }
    }

    /* Parse exponent. */
    if (base >= 10 && casecmp(*p, (uint32_t)(base == 16 ? 'p' : 'e'))) {
      uint32_t xx;
      int negx = 0;
      fmt = STRSCAN_NUM; p++;
      if (*p == '+' || *p == '-') negx = (*p++ == '-');
      if (!lj_char_isdigit(*p)) return STRSCAN_ERROR;
      xx = (*p++ & 15);
      while (lj_char_isdigit(*p)) {
	xx = xx * 10 + (*p & 15);
	if (xx >= STRSCAN_MAXEXP) return STRSCAN_ERROR;
	p++;
      }
      ex += negx ? (int32_t)(~xx+1u) : (int32_t)xx;
    }

    /* Parse suffix. */
    if (*p) {
      /* I (IMAG), U (U32), LL (I64), ULL/LLU (U64), L (long), UL/LU (ulong). */
      /* NYI: f (float). Not needed until cp_number() handles non-integers. */
      if (casecmp(*p, 'i')) {
	if (!(opt & STRSCAN_OPT_IMAG)) return STRSCAN_ERROR;
	p++; fmt = STRSCAN_IMAG;
      } else if (fmt == STRSCAN_INT) {
	if (casecmp(*p, 'u')) p++, fmt = STRSCAN_U32;
	if (casecmp(*p, 'l')) {
	  p++;
	  if (casecmp(*p, 'l')) p++, fmt += STRSCAN_I64 - STRSCAN_INT;
	  else if (!(opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
	  else if (sizeof(long) == 8) fmt += STRSCAN_I64 - STRSCAN_INT;
	}
	if (casecmp(*p, 'u') && (fmt == STRSCAN_INT || fmt == STRSCAN_I64))
	  p++, fmt += STRSCAN_U32 - STRSCAN_INT;
	if ((fmt == STRSCAN_U32 && !(opt & STRSCAN_OPT_C)) ||
	    (fmt >= STRSCAN_I64 && !(opt & STRSCAN_OPT_LL)))
	  return STRSCAN_ERROR;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p) return STRSCAN_ERROR;
    }
    if (p < pe) return STRSCAN_ERROR;

    /* Fast path for decimal 32 bit integers. */
    if (fmt == STRSCAN_INT && base == 10 &&
	(dig < 10 || (dig == 10 && *sp <= '2' && x < 0x80000000u+neg))) {
      if ((opt & STRSCAN_OPT_TONUM)) {
	o->n = neg ? -(double)x : (double)x;
	return STRSCAN_NUM;
      } else if (x == 0 && neg) {
	o->n = -0.0;
	return STRSCAN_NUM;
      } else {
	o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	return STRSCAN_INT;
      }
    }

    /* Dispatch to base-specific parser. */
    if (base == 0 && !(fmt == STRSCAN_NUM || fmt == STRSCAN_IMAG))
      return strscan_oct(sp, o, fmt, neg, dig);
    if (base == 16)
      fmt = strscan_hex(sp, o, fmt, opt, ex, neg, dig);
    else if (base == 2)
      fmt = strscan_bin(sp, o, fmt, opt, ex, neg, dig);
    else
      fmt = strscan_dec(sp, o, fmt, opt, ex, neg, dig);

    /* Try to convert number to integer, if requested. */
    if (fmt == STRSCAN_NUM && (opt & STRSCAN_OPT_TOINT) && !tvismzero(o)) {
      double n = o->n;
      int32_t i = lj_num2int(n);
      if (n == (lua_Number)i) { o->i = i; return STRSCAN_INT; }
    }
    return fmt;
  }
}